

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSynchronizationOperation.cpp
# Opt level: O0

void __thiscall
vkt::synchronization::anon_unknown_0::CopyBuffer::Implementation::Implementation
          (Implementation *this,OperationContext *context,Resource *resource,AccessMode mode)

{
  PtrData<vkt::synchronization::Buffer,_de::DefaultDeleter<vkt::synchronization::Buffer>_> data;
  Allocator *pAVar1;
  Allocator *device_00;
  Buffer *pBVar2;
  BufferResource *pBVar3;
  Allocation *this_00;
  void *pvVar4;
  VkDeviceMemory memory;
  VkDeviceSize offset;
  Buffer *in_stack_fffffffffffffec8;
  undefined8 in_stack_fffffffffffffed0;
  VkDevice pVVar5;
  Allocation *alloc;
  VkBufferCreateInfo local_b0;
  PtrData<vkt::synchronization::Buffer,_de::DefaultDeleter<vkt::synchronization::Buffer>_> local_78;
  PtrData<vkt::synchronization::Buffer,_de::DefaultDeleter<vkt::synchronization::Buffer>_> *local_68
  ;
  VkBufferUsageFlags local_54;
  Allocator *pAStack_50;
  VkBufferUsageFlags hostBufferUsage;
  Allocator *allocator;
  VkDevice device;
  DeviceInterface *vk;
  AccessMode local_24;
  Resource *pRStack_20;
  AccessMode mode_local;
  Resource *resource_local;
  OperationContext *context_local;
  Implementation *this_local;
  
  local_24 = mode;
  pRStack_20 = resource;
  resource_local = (Resource *)context;
  context_local = (OperationContext *)this;
  Operation::Operation(&this->super_Operation);
  (this->super_Operation)._vptr_Operation = (_func_int **)&PTR__Implementation_016b30b0;
  this->m_context = (OperationContext *)resource_local;
  this->m_resource = pRStack_20;
  this->m_mode = local_24;
  de::details::
  MovePtr<vkt::synchronization::Buffer,_de::DefaultDeleter<vkt::synchronization::Buffer>_>::MovePtr
            (&this->m_hostBuffer);
  device = (VkDevice)OperationContext::getDeviceInterface(this->m_context);
  allocator = (Allocator *)OperationContext::getDevice(this->m_context);
  pAStack_50 = OperationContext::getAllocator(this->m_context);
  local_54 = (this->m_mode == ACCESS_MODE_READ) + 1;
  pBVar2 = (Buffer *)operator_new(0x30);
  pVVar5 = device;
  device_00 = allocator;
  pAVar1 = pAStack_50;
  pBVar3 = Resource::getBuffer(this->m_resource);
  makeBufferCreateInfo(&local_b0,pBVar3->size,local_54);
  alloc._4_4_ = ::vk::MemoryRequirement::HostVisible.m_flags;
  synchronization::Buffer::Buffer
            (pBVar2,(DeviceInterface *)pVVar5,(VkDevice)device_00,pAVar1,&local_b0,
             ::vk::MemoryRequirement::HostVisible);
  de::DefaultDeleter<vkt::synchronization::Buffer>::DefaultDeleter
            ((DefaultDeleter<vkt::synchronization::Buffer> *)((long)&alloc + 3));
  de::details::
  MovePtr<vkt::synchronization::Buffer,_de::DefaultDeleter<vkt::synchronization::Buffer>_>::MovePtr
            ((MovePtr<vkt::synchronization::Buffer,_de::DefaultDeleter<vkt::synchronization::Buffer>_>
              *)&local_78);
  local_68 = de::details::MovePtr::operator_cast_to_PtrData(&local_78,(MovePtr *)pBVar2);
  data._8_8_ = in_stack_fffffffffffffed0;
  data.ptr = in_stack_fffffffffffffec8;
  de::details::
  MovePtr<vkt::synchronization::Buffer,_de::DefaultDeleter<vkt::synchronization::Buffer>_>::
  operator=(&this->m_hostBuffer,data);
  de::details::
  MovePtr<vkt::synchronization::Buffer,_de::DefaultDeleter<vkt::synchronization::Buffer>_>::~MovePtr
            ((MovePtr<vkt::synchronization::Buffer,_de::DefaultDeleter<vkt::synchronization::Buffer>_>
              *)&local_78);
  pBVar2 = de::details::
           UniqueBase<vkt::synchronization::Buffer,_de::DefaultDeleter<vkt::synchronization::Buffer>_>
           ::operator->(&(this->m_hostBuffer).
                         super_UniqueBase<vkt::synchronization::Buffer,_de::DefaultDeleter<vkt::synchronization::Buffer>_>
                       );
  this_00 = synchronization::Buffer::getAllocation(pBVar2);
  if (this->m_mode == ACCESS_MODE_READ) {
    pvVar4 = ::vk::Allocation::getHostPtr(this_00);
    pBVar3 = Resource::getBuffer(this->m_resource);
    ::deMemset(pvVar4,0,pBVar3->size);
  }
  else {
    pvVar4 = ::vk::Allocation::getHostPtr(this_00);
    pBVar3 = Resource::getBuffer(this->m_resource);
    fillPattern(pvVar4,pBVar3->size);
  }
  pAVar1 = allocator;
  pVVar5 = device;
  memory = ::vk::Allocation::getMemory(this_00);
  offset = ::vk::Allocation::getOffset(this_00);
  pBVar3 = Resource::getBuffer(this->m_resource);
  ::vk::flushMappedMemoryRange
            ((DeviceInterface *)pVVar5,(VkDevice)pAVar1,memory,offset,pBVar3->size);
  return;
}

Assistant:

Implementation (OperationContext& context, Resource& resource, const AccessMode mode)
		: m_context		(context)
		, m_resource	(resource)
		, m_mode		(mode)
	{
		const DeviceInterface&	vk			= m_context.getDeviceInterface();
		const VkDevice			device		= m_context.getDevice();
		Allocator&				allocator	= m_context.getAllocator();

		const VkBufferUsageFlags hostBufferUsage = (m_mode == ACCESS_MODE_READ ? VK_BUFFER_USAGE_TRANSFER_DST_BIT : VK_BUFFER_USAGE_TRANSFER_SRC_BIT);

		m_hostBuffer = de::MovePtr<Buffer>(new Buffer(
			vk, device, allocator, makeBufferCreateInfo(m_resource.getBuffer().size, hostBufferUsage), MemoryRequirement::HostVisible));

		const Allocation& alloc = m_hostBuffer->getAllocation();
		if (m_mode == ACCESS_MODE_READ)
			deMemset(alloc.getHostPtr(), 0, static_cast<size_t>(m_resource.getBuffer().size));
		else
			fillPattern(alloc.getHostPtr(), m_resource.getBuffer().size);
		flushMappedMemoryRange(vk, device, alloc.getMemory(), alloc.getOffset(), m_resource.getBuffer().size);
	}